

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void duckdb::ParquetWriter::SetSchemaProperties(LogicalType *duckdb_type,SchemaElement *schema_ele)

{
  _LogicalType__isset *p_Var1;
  _TimeUnit__isset *p_Var2;
  undefined1 *puVar3;
  ushort uVar4;
  bool bVar5;
  byte bVar6;
  _SchemaElement__isset _Var7;
  JsonType JStack_18;
  
  bVar5 = LogicalType::IsJSONType(duckdb_type);
  if (bVar5) {
    schema_ele->converted_type = JSON;
    schema_ele->__isset = (_SchemaElement__isset)((ushort)schema_ele->__isset | 0x110);
    duckdb_parquet::JsonType::JsonType(&JStack_18);
    duckdb_parquet::LogicalType::__set_JSON(&schema_ele->logicalType,&JStack_18);
    duckdb_parquet::JsonType::~JsonType(&JStack_18);
    return;
  }
  switch(duckdb_type->id_) {
  case TINYINT:
    schema_ele->converted_type = INT_8;
    break;
  case SMALLINT:
    schema_ele->converted_type = INT_16;
    break;
  case INTEGER:
    schema_ele->converted_type = INT_32;
    break;
  case BIGINT:
    schema_ele->converted_type = INT_64;
    break;
  case DATE:
    schema_ele->converted_type = DATE;
    break;
  case TIME:
  case TIME_TZ:
    schema_ele->converted_type = TIME_MICROS;
    schema_ele->__isset = (_SchemaElement__isset)((ushort)schema_ele->__isset | 0x110);
    p_Var1 = &(schema_ele->logicalType).__isset;
    *(byte *)p_Var1 = *(byte *)p_Var1 | 0x40;
    (schema_ele->logicalType).TIME.isAdjustedToUTC = duckdb_type->id_ == TIME_TZ;
    p_Var2 = &(schema_ele->logicalType).TIME.unit.__isset;
    *p_Var2 = (_TimeUnit__isset)((byte)*p_Var2 | 2);
    return;
  case TIMESTAMP_SEC:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    schema_ele->converted_type = TIMESTAMP_MICROS;
    schema_ele->__isset = (_SchemaElement__isset)((ushort)schema_ele->__isset | 0x110);
    p_Var1 = &(schema_ele->logicalType).__isset;
    *(byte *)p_Var1 = *(byte *)p_Var1 | 0x80;
    (schema_ele->logicalType).TIMESTAMP.isAdjustedToUTC = duckdb_type->id_ == TIMESTAMP_TZ;
    p_Var2 = &(schema_ele->logicalType).TIMESTAMP.unit.__isset;
    *p_Var2 = (_TimeUnit__isset)((byte)*p_Var2 | 2);
    return;
  case TIMESTAMP_MS:
    schema_ele->converted_type = TIMESTAMP_MILLIS;
    schema_ele->__isset = (_SchemaElement__isset)((ushort)schema_ele->__isset | 0x110);
    p_Var1 = &(schema_ele->logicalType).__isset;
    *(byte *)p_Var1 = *(byte *)p_Var1 | 0x80;
    (schema_ele->logicalType).TIMESTAMP.isAdjustedToUTC = false;
    p_Var2 = &(schema_ele->logicalType).TIMESTAMP.unit.__isset;
    *p_Var2 = (_TimeUnit__isset)((byte)*p_Var2 | 1);
    return;
  case TIMESTAMP_NS:
    schema_ele->__isset =
         (_SchemaElement__isset)((ushort)*(undefined4 *)&schema_ele->__isset & 0xfeef | 0x100);
    p_Var1 = &(schema_ele->logicalType).__isset;
    *(byte *)p_Var1 = *(byte *)p_Var1 | 0x80;
    (schema_ele->logicalType).TIMESTAMP.isAdjustedToUTC = false;
    p_Var2 = &(schema_ele->logicalType).TIMESTAMP.unit.__isset;
    *p_Var2 = (_TimeUnit__isset)((byte)*p_Var2 | 4);
    return;
  case DECIMAL:
    schema_ele->converted_type = DECIMAL;
    bVar6 = DecimalType::GetWidth(duckdb_type);
    schema_ele->precision = (uint)bVar6;
    bVar6 = DecimalType::GetScale(duckdb_type);
    schema_ele->scale = (uint)bVar6;
    uVar4 = (ushort)*(undefined4 *)&schema_ele->__isset;
    _Var7 = (_SchemaElement__isset)(uVar4 | 0x70);
    schema_ele->__isset = _Var7;
    if (duckdb_type->physical_type_ == INT128) {
      schema_ele->type_length = 0x10;
      _Var7 = (_SchemaElement__isset)(uVar4 | 0x72);
      schema_ele->__isset = _Var7;
    }
    schema_ele->__isset = (_SchemaElement__isset)((ushort)_Var7 | 0x100);
    p_Var1 = &(schema_ele->logicalType).__isset;
    *(byte *)p_Var1 = *(byte *)p_Var1 | 0x10;
    (schema_ele->logicalType).DECIMAL.precision = schema_ele->precision;
    (schema_ele->logicalType).DECIMAL.scale = (uint)bVar6;
    return;
  case FLOAT:
  case DOUBLE:
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case UHUGEINT:
  case HUGEINT:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    goto switchD_01db7864_caseD_16;
  case INTERVAL:
    schema_ele->type_length = 0xc;
    schema_ele->converted_type = INTERVAL;
    *(byte *)&schema_ele->__isset = *(byte *)&schema_ele->__isset | 0x12;
    return;
  case UTINYINT:
    schema_ele->converted_type = UINT_8;
    break;
  case USMALLINT:
    schema_ele->converted_type = UINT_16;
    break;
  case UINTEGER:
    schema_ele->converted_type = UINT_32;
    break;
  case UBIGINT:
    schema_ele->converted_type = UINT_64;
    break;
  case UUID:
    schema_ele->type_length = 0x10;
    schema_ele->__isset = (_SchemaElement__isset)((ushort)schema_ele->__isset | 0x102);
    puVar3 = &(schema_ele->logicalType).__isset.field_0x1;
    *puVar3 = *puVar3 | 0x10;
    return;
  default:
    if (duckdb_type->id_ != ENUM) {
      return;
    }
  case VARCHAR:
    schema_ele->converted_type = UTF8;
  }
  *(byte *)&schema_ele->__isset = *(byte *)&schema_ele->__isset | 0x10;
switchD_01db7864_caseD_16:
  return;
}

Assistant:

void ParquetWriter::SetSchemaProperties(const LogicalType &duckdb_type, duckdb_parquet::SchemaElement &schema_ele) {
	if (duckdb_type.IsJSONType()) {
		schema_ele.converted_type = ConvertedType::JSON;
		schema_ele.__isset.converted_type = true;
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__set_JSON(duckdb_parquet::JsonType());
		return;
	}
	switch (duckdb_type.id()) {
	case LogicalTypeId::TINYINT:
		schema_ele.converted_type = ConvertedType::INT_8;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::SMALLINT:
		schema_ele.converted_type = ConvertedType::INT_16;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::INTEGER:
		schema_ele.converted_type = ConvertedType::INT_32;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::BIGINT:
		schema_ele.converted_type = ConvertedType::INT_64;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::UTINYINT:
		schema_ele.converted_type = ConvertedType::UINT_8;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::USMALLINT:
		schema_ele.converted_type = ConvertedType::UINT_16;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::UINTEGER:
		schema_ele.converted_type = ConvertedType::UINT_32;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::UBIGINT:
		schema_ele.converted_type = ConvertedType::UINT_64;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::DATE:
		schema_ele.converted_type = ConvertedType::DATE;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::TIME_TZ:
	case LogicalTypeId::TIME:
		schema_ele.converted_type = ConvertedType::TIME_MICROS;
		schema_ele.__isset.converted_type = true;
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__isset.TIME = true;
		schema_ele.logicalType.TIME.isAdjustedToUTC = (duckdb_type.id() == LogicalTypeId::TIME_TZ);
		schema_ele.logicalType.TIME.unit.__isset.MICROS = true;
		break;
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_SEC:
		schema_ele.converted_type = ConvertedType::TIMESTAMP_MICROS;
		schema_ele.__isset.converted_type = true;
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__isset.TIMESTAMP = true;
		schema_ele.logicalType.TIMESTAMP.isAdjustedToUTC = (duckdb_type.id() == LogicalTypeId::TIMESTAMP_TZ);
		schema_ele.logicalType.TIMESTAMP.unit.__isset.MICROS = true;
		break;
	case LogicalTypeId::TIMESTAMP_NS:
		schema_ele.__isset.converted_type = false;
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__isset.TIMESTAMP = true;
		schema_ele.logicalType.TIMESTAMP.isAdjustedToUTC = false;
		schema_ele.logicalType.TIMESTAMP.unit.__isset.NANOS = true;
		break;
	case LogicalTypeId::TIMESTAMP_MS:
		schema_ele.converted_type = ConvertedType::TIMESTAMP_MILLIS;
		schema_ele.__isset.converted_type = true;
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__isset.TIMESTAMP = true;
		schema_ele.logicalType.TIMESTAMP.isAdjustedToUTC = false;
		schema_ele.logicalType.TIMESTAMP.unit.__isset.MILLIS = true;
		break;
	case LogicalTypeId::ENUM:
	case LogicalTypeId::VARCHAR:
		schema_ele.converted_type = ConvertedType::UTF8;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::INTERVAL:
		schema_ele.type_length = 12;
		schema_ele.converted_type = ConvertedType::INTERVAL;
		schema_ele.__isset.type_length = true;
		schema_ele.__isset.converted_type = true;
		break;
	case LogicalTypeId::UUID:
		schema_ele.type_length = 16;
		schema_ele.__isset.type_length = true;
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__isset.UUID = true;
		break;
	case LogicalTypeId::DECIMAL:
		schema_ele.converted_type = ConvertedType::DECIMAL;
		schema_ele.precision = DecimalType::GetWidth(duckdb_type);
		schema_ele.scale = DecimalType::GetScale(duckdb_type);
		schema_ele.__isset.converted_type = true;
		schema_ele.__isset.precision = true;
		schema_ele.__isset.scale = true;
		if (duckdb_type.InternalType() == PhysicalType::INT128) {
			schema_ele.type_length = 16;
			schema_ele.__isset.type_length = true;
		}
		schema_ele.__isset.logicalType = true;
		schema_ele.logicalType.__isset.DECIMAL = true;
		schema_ele.logicalType.DECIMAL.precision = schema_ele.precision;
		schema_ele.logicalType.DECIMAL.scale = schema_ele.scale;
		break;
	default:
		break;
	}
}